

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  string *psVar1;
  TextureFormat TVar2;
  long lVar3;
  string *psVar4;
  ChannelOrder CVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint z;
  bool bVar11;
  uint uVar12;
  float fVar13;
  ConstPixelBufferAccess local_90;
  TestStatus *local_68;
  VkImageCreateInfo *local_60;
  ulong local_58;
  ConstPixelBufferAccess *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_38;
  
  uVar12 = (imageMSInfo->extent).depth;
  local_90.m_data = imageRSInfo;
  local_68 = __return_storage_ptr__;
  local_60 = imageMSInfo;
  local_50 = dataRS;
  local_38 = dataPerSample;
  if (uVar12 != 0) {
    uVar6 = (imageMSInfo->extent).height;
    uVar7 = (ulong)imageMSInfo->samples;
    local_40 = (string *)&__return_storage_ptr__->m_description;
    local_48 = &(__return_storage_ptr__->m_description).field_2;
    lVar3 = uVar7 * 0x28;
    uVar10 = 0;
    uVar8 = uVar6;
    local_58 = uVar7;
    do {
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar12 = (local_60->extent).width;
        z = 0;
        uVar8 = uVar12;
        do {
          if (uVar8 == 0) {
            uVar8 = 0;
          }
          else {
            uVar6 = 0;
            do {
              if ((int)uVar7 != 0) {
                lVar9 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_90,
                             (int)(local_38->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (int)lVar9,uVar6,z);
                  CVar5 = local_90.m_format.order;
                  if ((local_90.m_format.order != R) && (local_90.m_format.order != 0xff)) {
                    local_90.m_format = (TextureFormat)(local_90.m_size.m_data + 2);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_90,
                               "Expected color to be zero or saturated on the first channel","");
                    local_68->m_code = QP_TEST_RESULT_FAIL;
                    (local_68->m_description)._M_dataplus._M_p = (pointer)local_48;
                    std::__cxx11::string::_M_construct<char*>
                              (local_40,local_90.m_format,
                               local_90.m_size.m_data._0_8_ + (long)local_90.m_format);
                    if (local_90.m_format != (TextureFormat)(local_90.m_size.m_data + 2)) {
                      operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
                    }
                    if (CVar5 != 0xff) {
                      return local_68;
                    }
                  }
                  lVar9 = lVar9 + 0x28;
                } while (lVar3 != lVar9);
                uVar12 = (local_60->extent).width;
                uVar7 = local_58;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar12);
            uVar6 = (local_60->extent).height;
            uVar8 = uVar12;
          }
          z = z + 1;
        } while (z < uVar6);
        uVar12 = (local_60->extent).depth;
        uVar8 = uVar6;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar12);
  }
  uVar12 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->depth;
  if (uVar12 != 0) {
    psVar1 = &local_68->m_description;
    psVar4 = &local_68->m_description;
    uVar6 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->height;
    uVar10 = 0;
    uVar8 = uVar6;
    do {
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar12 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->width;
        uVar8 = 0;
        do {
          bVar11 = uVar12 != 0;
          uVar12 = 0;
          if (bVar11) {
            uVar6 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel(&local_90,(int)local_50,uVar6,uVar8);
              fVar13 = (float)local_90.m_format.order + -0.5;
              uVar12 = -(uint)(-fVar13 <= fVar13);
              if (0.02 < (float)(~uVar12 & (uint)-fVar13 | (uint)fVar13 & uVar12)) {
                TVar2 = (TextureFormat)(local_90.m_size.m_data + 2);
                local_90.m_format = TVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_90,
                           "Expected resolve color to be half intensity on the first channel","");
                local_68->m_code = QP_TEST_RESULT_FAIL;
                (local_68->m_description)._M_dataplus._M_p = (pointer)&psVar4->field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)psVar1,local_90.m_format,
                           (undefined1 *)(local_90.m_size.m_data._0_8_ + (long)local_90.m_format));
                if (local_90.m_format == TVar2) {
                  return local_68;
                }
                goto LAB_004e35c6;
              }
              uVar6 = uVar6 + 1;
              uVar12 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->width;
            } while (uVar6 < uVar12);
            uVar6 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->height;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar6);
        uVar12 = ((VkExtent3D *)((long)local_90.m_data + 0x1c))->depth;
        uVar8 = uVar6;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar12);
  }
  TVar2 = (TextureFormat)(local_90.m_size.m_data + 2);
  local_90.m_format = TVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Passed","");
  local_68->m_code = QP_TEST_RESULT_PASS;
  (local_68->m_description)._M_dataplus._M_p = (pointer)&(local_68->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68->m_description,local_90.m_format,
             (undefined1 *)(local_90.m_size.m_data._0_8_ + (long)local_90.m_format));
  if (local_90.m_format != TVar2) {
LAB_004e35c6:
    operator_delete((void *)local_90.m_format,local_90._16_8_ + 1);
  }
  return local_68;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskWrite>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																					 const vk::VkImageCreateInfo&						imageRSInfo,
																					 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																					 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 firstComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z)[0];

			if (firstComponent != 0u && firstComponent != 255u)
				return tcu::TestStatus::fail("Expected color to be zero or saturated on the first channel");
		}
	}

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const float firstComponent = dataRS.getPixel(x, y, z)[0];

		if (deFloatAbs(firstComponent - 0.5f) > 0.02f)
			return tcu::TestStatus::fail("Expected resolve color to be half intensity on the first channel");
	}

	return tcu::TestStatus::pass("Passed");
}